

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

int QMessageBoxPrivate::showOldMessageBox
              (QWidget *parent,Icon icon,QString *title,QString *text,QString *button0Text,
              QString *button1Text,QString *button2Text,int defaultButtonNumber,
              int escapeButtonNumber)

{
  bool bVar1;
  QFlagsStorage<Qt::WindowType> QVar2;
  int iVar3;
  qsizetype qVar4;
  QDialog *in_RCX;
  QPushButton *in_RDX;
  undefined4 in_ESI;
  QMessageBox *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QList<QAbstractButton_*> *buttonList;
  QString myButton0Text;
  QMessageBox messageBox;
  StandardButton in_stack_ffffffffffffff0c;
  enum_type in_stack_ffffffffffffff10;
  enum_type in_stack_ffffffffffffff14;
  QMessageBox *in_stack_ffffffffffffff18;
  ButtonRole in_stack_ffffffffffffff24;
  QWidget *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_30,0xaa,0x28);
  QFlags<QMessageBox::StandardButton>::QFlags
            ((QFlags<QMessageBox::StandardButton> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff0c
            );
  QVar2.i = (Int)Qt::operator|(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
  QMessageBox::QMessageBox
            (in_RDI,(Icon)((ulong)in_RCX >> 0x20),(QString *)in_RDX,
             (QString *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
             (QFlagsStorageHelper<QMessageBox::StandardButton,_4>)SUB84((ulong)in_R8 >> 0x20,0),
             in_stack_ffffffffffffff28,(QFlagsStorageHelper<Qt::WindowType,_4>)SUB84(in_R8,0));
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (QString *)CONCAT44(in_stack_ffffffffffffff0c,QVar2.i));
  bVar1 = QString::isEmpty((QString *)0x7a7d0f);
  if (bVar1) {
    QDialogButtonBox::tr
              ((char *)in_stack_ffffffffffffff18,
               (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c);
    QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (QString *)CONCAT44(in_stack_ffffffffffffff0c,QVar2.i));
    QString::~QString((QString *)0x7a7d54);
  }
  QMessageBox::addButton
            ((QMessageBox *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
             (QString *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  bVar1 = QString::isEmpty((QString *)0x7a7d78);
  if (!bVar1) {
    QMessageBox::addButton
              ((QMessageBox *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
               (QString *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  }
  bVar1 = QString::isEmpty((QString *)0x7a7da0);
  if (!bVar1) {
    QMessageBox::addButton
              ((QMessageBox *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
               (QString *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
  }
  QMessageBox::d_func((QMessageBox *)0x7a7ddf);
  QList<QAbstractButton_*>::value
            ((QList<QAbstractButton_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,QVar2.i));
  QMessageBox::setDefaultButton(in_stack_ffffffffffffff18,in_RDX);
  QList<QAbstractButton_*>::value
            ((QList<QAbstractButton_*> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             CONCAT44(in_stack_ffffffffffffff0c,QVar2.i));
  QMessageBox::setEscapeButton(in_stack_ffffffffffffff18,&in_RDX->super_QAbstractButton);
  QDialog::exec(in_RCX);
  QMessageBox::clickedButton
            ((QMessageBox *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  qVar4 = QListSpecialMethodsBase<QAbstractButton*>::indexOf<QAbstractButton*>
                    ((QListSpecialMethodsBase<QAbstractButton_*> *)
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QAbstractButton **)CONCAT44(in_stack_ffffffffffffff0c,QVar2.i),0x7a7e64);
  iVar3 = (int)qVar4;
  QString::~QString((QString *)0x7a7e75);
  QMessageBox::~QMessageBox((QMessageBox *)0x7a7e7f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QMessageBoxPrivate::showOldMessageBox(QWidget *parent, QMessageBox::Icon icon,
                                            const QString &title, const QString &text,
                                            const QString &button0Text,
                                            const QString &button1Text,
                                            const QString &button2Text,
                                            int defaultButtonNumber,
                                            int escapeButtonNumber)
{
    QMessageBox messageBox(icon, title, text, QMessageBox::NoButton, parent);
    QString myButton0Text = button0Text;
    if (myButton0Text.isEmpty())
        myButton0Text = QDialogButtonBox::tr("OK");
    messageBox.addButton(myButton0Text, QMessageBox::ActionRole);
    if (!button1Text.isEmpty())
        messageBox.addButton(button1Text, QMessageBox::ActionRole);
    if (!button2Text.isEmpty())
        messageBox.addButton(button2Text, QMessageBox::ActionRole);

    const QList<QAbstractButton *> &buttonList = messageBox.d_func()->customButtonList;
    messageBox.setDefaultButton(static_cast<QPushButton *>(buttonList.value(defaultButtonNumber)));
    messageBox.setEscapeButton(buttonList.value(escapeButtonNumber));

    messageBox.exec();

    // Ignore exec return value and use button index instead,
    // as that's what the documentation promises.
    return buttonList.indexOf(messageBox.clickedButton());
}